

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi_io.c
# Opt level: O0

int kvtree_write_gather(char *prefix,kvtree *data,MPI_Comm comm)

{
  int iVar1;
  unsigned_long uVar2;
  ssize_t sVar3;
  ssize_t write_rc;
  size_t bufsize;
  void *buf;
  int fd;
  mode_t mode;
  int valid;
  int level;
  unsigned_long offset;
  char mappath [1024];
  char mapfile [1024];
  kvtree *local_60;
  kvtree *save;
  kvtree *recv;
  kvtree *send;
  unsigned_long pack_size;
  uint local_38;
  int allranks;
  int writer;
  int ranks_world;
  int rank_world;
  int rc;
  MPI_Comm comm_local;
  kvtree *data_local;
  char *prefix_local;
  
  ranks_world = 0;
  _rank_world = comm;
  comm_local = (MPI_Comm)data;
  data_local = (kvtree *)prefix;
  MPI_Comm_rank(comm,&writer);
  MPI_Comm_size(_rank_world,&allranks);
  send = (kvtree *)kvtree_pack_size((kvtree *)comm_local);
  pick_writer(1,(unsigned_long)send,(int *)&local_38,(int *)((long)&pack_size + 4),_rank_world);
  recv = kvtree_new();
  save = kvtree_new();
  kvtree_exchange_sendq(recv,local_38,(kvtree *)comm_local);
  kvtree_exchange_direction(recv,save,_rank_world,KVTREE_EXCHANGE_LEFT);
  local_60 = kvtree_new();
  if (writer == local_38) {
    kvtree_set(local_60,"RANK",save);
    save = (kvtree *)0x0;
  }
  kvtree_delete(&save);
  kvtree_delete(&recv);
  snprintf(mappath + 0x3f8,0x400,".0.%d",(ulong)local_38);
  snprintf((char *)&offset,0x400,"%s%s",data_local,mappath + 0x3f8);
  _valid = 0;
  mode = 1;
  fd = (int)(writer == local_38);
  uVar2 = kvtree_write_gather_map((char *)data_local,mappath + 0x3f8,0,1,fd,_rank_world);
  if (uVar2 != 0) {
    ranks_world = 1;
  }
  if (writer == local_38) {
    buf._4_4_ = kvtree_getmode(1,1,0);
    buf._0_4_ = kvtree_open((char *)&offset,0x241,(ulong)buf._4_4_);
    if ((int)buf < 0) {
      kvtree_err("Opening file for write: %s @ %s:%d",&offset,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                 ,0x16a);
      ranks_world = 1;
    }
    else {
      kvtree_util_set_int(local_60,"LEVEL",0);
      kvtree_util_set_int(local_60,"RANKS",allranks);
      kvtree_write_persist((void **)&bufsize,(size_t *)&write_rc,local_60);
      kvtree_lseek((char *)&offset,(int)buf,_valid,0);
      sVar3 = kvtree_write_attempt((char *)&offset,(int)buf,(void *)bufsize,write_rc);
      if (sVar3 < 0) {
        ranks_world = 1;
      }
      kvtree_free(&bufsize);
      kvtree_close((char *)&offset,(int)buf);
    }
  }
  kvtree_delete(&local_60);
  iVar1 = kvtree_alltrue((uint)(ranks_world == 0),_rank_world);
  prefix_local._4_4_ = (uint)(iVar1 == 0);
  return prefix_local._4_4_;
}

Assistant:

int kvtree_write_gather(
  const char* prefix,
  kvtree* data,
  MPI_Comm comm)
{
  int rc = KVTREE_SUCCESS;

  /* get name of this process */
  int rank_world, ranks_world;
  MPI_Comm_rank(comm, &rank_world);
  MPI_Comm_size(comm, &ranks_world);

  /* pick our writer so that we send roughly 1MB of data to each */
  int writer, allranks;
  unsigned long pack_size = (unsigned long) kvtree_pack_size(data);
  pick_writer(1, pack_size, &writer, &allranks, comm);

  /* create send and receive hashes */
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();

  /* copy data into send hash */
  kvtree_exchange_sendq(send, writer, data);

  /* gather hashes to writers */
  kvtree_exchange_direction(send, recv, comm, KVTREE_EXCHANGE_LEFT);

  /* persist received hash */
  kvtree* save = kvtree_new();
  if (rank_world == writer) {
    /* record hash containing file names indexed by rank,
     * attach received hash to save hash and set recv to NULL
     * since we no longer need to free it */
    kvtree_set(save, "RANK", recv);
    recv = NULL;
  }

  /* free our hash data */
  kvtree_delete(&recv);
  kvtree_delete(&send);

  /* define file name */
  char mapfile[1024];
  char mappath[1024];
  snprintf(mapfile, sizeof(mapfile), ".0.%d", writer);
  snprintf(mappath, sizeof(mappath), "%s%s", prefix, mapfile);

  /* write map to files */
  unsigned long offset = 0;
  int level = 1;
  int valid = 0;
  if (rank_world == writer) {
    valid = 1;
  }
  if (kvtree_write_gather_map(prefix, mapfile, offset, level, valid, comm) != KVTREE_SUCCESS)
  {
    rc = KVTREE_FAILURE;
  }

  /* write blocks of summary data */
  if (rank_world == writer) {
    /* open the file if we need to */
    mode_t mode = kvtree_getmode(1, 1, 0);
    int fd = kvtree_open(mappath, O_WRONLY | O_CREAT | O_TRUNC, mode);
    if (fd >= 0) {
      /* store level value in hash */
      kvtree_util_set_int(save, "LEVEL", 0);

      /* record global number of ranks */
      kvtree_util_set_int(save, "RANKS", ranks_world);

      /* persist and compress hash */
      void* buf;
      size_t bufsize;
      kvtree_write_persist(&buf, &bufsize, save);

      /* write data to file */
      kvtree_lseek(mappath, fd, offset, SEEK_SET);
      ssize_t write_rc = kvtree_write_attempt(mappath, fd, buf, bufsize);
      if (write_rc < 0) {
        rc = KVTREE_FAILURE;
      }

      /* free memory */
      kvtree_free(&buf);

      /* close the file */
      kvtree_close(mappath, fd);
    } else {
      kvtree_err( "Opening file for write: %s @ %s:%d",
        mappath, __FILE__, __LINE__
      );
      rc = KVTREE_FAILURE;
    }
  }

  /* free the hash */
  kvtree_delete(&save);

  /* determine whether everyone wrote their files ok */
  if (kvtree_alltrue(rc == KVTREE_SUCCESS, comm)) {
    return KVTREE_SUCCESS;
  }
  return KVTREE_FAILURE;
}